

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O0

bool __thiscall dg::pta::PointerIdPointsToSet::add(PointerIdPointsToSet *this,Pointer *ptr)

{
  bool bVar1;
  PointerIdPointsToSet *in_RSI;
  Pointer *in_stack_ffffffffffffffb8;
  PSNode *n;
  Offset local_30;
  PSNode *in_stack_ffffffffffffffd8;
  Offset in_stack_ffffffffffffffe0;
  bool local_1;
  
  n = (PSNode *)
      (in_RSI->pointers)._bits.
      super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
      .
      super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
      ._M_h._M_buckets;
  Offset::Offset(&local_30,Offset::UNKNOWN);
  Pointer::Pointer((Pointer *)&stack0xffffffffffffffd8,n,local_30);
  bVar1 = has((PointerIdPointsToSet *)n,in_stack_ffffffffffffffb8);
  if (bVar1) {
    local_1 = false;
  }
  else {
    bVar1 = Offset::isUnknown((Offset *)
                              &(in_RSI->pointers)._bits.
                               super_HashMapImpl<unsigned_long,_unsigned_long,_std::unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
                               .
                               super_unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                               ._M_h._M_bucket_count);
    if (bVar1) {
      local_1 = addWithUnknownOffset(in_RSI,(PSNode *)in_stack_ffffffffffffffe0.offset);
    }
    else {
      getPointerID((Pointer *)0x160bd1);
      bVar1 = ADT::
              SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              ::set((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                     *)in_stack_ffffffffffffffe0.offset,(unsigned_long)in_stack_ffffffffffffffd8);
      local_1 = (bool)((bVar1 ^ 0xffU) & 1);
    }
  }
  return local_1;
}

Assistant:

bool add(const Pointer &ptr) {
        if (has({ptr.target, Offset::UNKNOWN})) {
            return false;
        }
        if (ptr.offset.isUnknown()) {
            return addWithUnknownOffset(ptr.target);
        }
        return !pointers.set(getPointerID(ptr));
    }